

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

void __thiscall
QLibraryPrivate::QLibraryPrivate
          (QLibraryPrivate *this,QString *canonicalFileName,QString *version,LoadHints loadHints)

{
  bool bVar1;
  long in_RDI;
  QString *this_00;
  char *s;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QString *in_stack_ffffffffffffff60;
  QFlags<QLibrary::LoadHint> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(in_stack_ffffffffffffff60,
                   (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QString::QString(in_stack_ffffffffffffff60,
                   (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QAtomicPointer<QObject_*()>::QAtomicPointer
            ((QAtomicPointer<QObject_*()> *)in_stack_ffffffffffffff60,
             (_func_QObject_ptr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QAtomicPointer<void>::QAtomicPointer
            ((QAtomicPointer<void> *)in_stack_ffffffffffffff60,
             (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QMutex::QMutex((QMutex *)0x8c20f3);
  QPointer<QObject>::QPointer((QPointer<QObject> *)0x8c2108);
  QPluginParsedMetaData::QPluginParsedMetaData((QPluginParsedMetaData *)0x8c211b);
  this_00 = (QString *)(in_RDI + 0x70);
  QString::QString((QString *)0x8c2130);
  s = (char *)(in_RDI + 0x88);
  QString::QString((QString *)0x8c2146);
  QAtomicInt::QAtomicInt((QAtomicInt *)this_00,in_stack_ffffffffffffff5c);
  QAtomicInt::QAtomicInt((QAtomicInt *)this_00,in_stack_ffffffffffffff5c);
  QAtomicInt::QAtomicInt((QAtomicInt *)this_00,in_stack_ffffffffffffff5c);
  *(undefined4 *)(in_RDI + 0xac) = 2;
  QFlags<QLibrary::LoadHint>::toInt(&local_c);
  QBasicAtomicInteger<int>::storeRelaxed
            ((QBasicAtomicInteger<int> *)this_00,in_stack_ffffffffffffff5c);
  bVar1 = QString::isEmpty((QString *)0x8c21bc);
  if (bVar1) {
    QLibrary::tr(s,(char *)this_00,in_stack_ffffffffffffff5c);
    QString::operator=(this_00,(QString *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QString::~QString((QString *)0x8c2207);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QLibraryPrivate::QLibraryPrivate(const QString &canonicalFileName, const QString &version, QLibrary::LoadHints loadHints)
    : fileName(canonicalFileName), fullVersion(version), pluginState(MightBeAPlugin)
{
    loadHintsInt.storeRelaxed(loadHints.toInt());
    if (canonicalFileName.isEmpty())
        errorString = QLibrary::tr("The shared library was not found.");
}